

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O2

Gia_Man_t *
Gia_ManSweepWithBoxesAndDomains
          (Gia_Man_t *p,void *pParsS,int fConst,int fEquiv,int fVerbose,int fVerbEquivs)

{
  int Entry;
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Gia_Man_t *p_00;
  Gia_Man_t *pGVar6;
  int *pReprs;
  ulong uVar7;
  uint uVar8;
  int pFlopTypes [3];
  
  iVar3 = Vec_IntFindMax(p->vRegClasses);
  pFlopTypes[2] = 0;
  pFlopTypes[0] = 0;
  pFlopTypes[1] = 0;
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0x28b,
                  "Gia_Man_t *Gia_ManSweepWithBoxesAndDomains(Gia_Man_t *, void *, int, int, int, int)"
                 );
  }
  if (p->pAigExtra == (Gia_Man_t *)0x0) {
    __assert_fail("p->pAigExtra != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0x28c,
                  "Gia_Man_t *Gia_ManSweepWithBoxesAndDomains(Gia_Man_t *, void *, int, int, int, int)"
                 );
  }
  if (iVar3 < 2) {
    __assert_fail("nDoms > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0x28d,
                  "Gia_Man_t *Gia_ManSweepWithBoxesAndDomains(Gia_Man_t *, void *, int, int, int, int)"
                 );
  }
  p_00 = Gia_ManDupUnnormalize(p);
  pGVar6 = (Gia_Man_t *)0x0;
  if (p_00 != (Gia_Man_t *)0x0) {
    Gia_ManTransferTiming(p_00,p);
    uVar7 = 1;
    while (Entry = (int)uVar7, Entry - iVar3 != 1) {
      uVar4 = Vec_IntCountEntry(p_00->vRegClasses,Entry);
      if (1 < (int)uVar4) {
        pGVar6 = Gia_ManDupCollapse(p_00,p_00->pAigExtra,(Vec_Int_t *)0x0,1);
        Gia_ManSweepComputeOneDomainEquivs
                  (pGVar6,p_00->vRegClasses,Entry,pParsS,fConst,fEquiv,fVerbose);
        pReprs = Gia_ManFraigSelectReprs(p_00,pGVar6,fVerbose,pFlopTypes);
        Gia_ManStop(pGVar6);
        Gia_ManTransferTiming(p,p_00);
        pGVar6 = Gia_ManFraigReduceGia(p_00,pReprs);
        Gia_ManTransferTiming(pGVar6,p);
        Gia_ManStop(p_00);
        free(pReprs);
        p_00 = Gia_ManDupWithBoxes(pGVar6,1);
        Gia_ManStop(pGVar6);
        uVar5 = Vec_IntCountEntry(p_00->vRegClasses,Entry);
        uVar1 = pFlopTypes._0_8_;
        iVar2 = pFlopTypes[1];
        uVar8 = uVar4 - (pFlopTypes[0] + pFlopTypes[1] + uVar5);
        pFlopTypes[2] = uVar8;
        if (fVerbEquivs != 0) {
          printf("Domain %2d : %5d -> %5d :  ",uVar7,(ulong)uVar4,(ulong)uVar5);
          uVar7 = 0;
          if (0 < (int)uVar8) {
            uVar7 = (ulong)uVar8;
          }
          uVar4 = -uVar8;
          if (-1 < (int)uVar8) {
            uVar4 = 0;
          }
          printf("EqConst =%4d.  EqFlop =%4d.  Dangling =%4d.  Unused =%4d.\n",uVar1 & 0xffffffff,
                 (ulong)(uint)iVar2,uVar7,(ulong)uVar4);
        }
      }
      uVar7 = (ulong)(Entry + 1);
    }
    pGVar6 = Gia_ManDupNormalize(p_00);
    Gia_ManTransferTiming(pGVar6,p_00);
    Gia_ManStop(p_00);
  }
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManSweepWithBoxesAndDomains( Gia_Man_t * p, void * pParsS, int fConst, int fEquiv, int fVerbose, int fVerbEquivs )
{ 
    Gia_Man_t * pClp, * pNew, * pTemp;
    int nDoms = Vec_IntFindMax(p->vRegClasses);
    int * pReprs, iDom, pFlopTypes[3] = {0};
    assert( Gia_ManRegNum(p) == 0 );
    assert( p->pAigExtra != NULL );
    assert( nDoms > 1 );
    // order AIG objects
    pNew = Gia_ManDupUnnormalize( p );
    if ( pNew == NULL )
        return NULL;
    Gia_ManTransferTiming( pNew, p );
    // iterate over domains
    for ( iDom = 1; iDom <= nDoms; iDom++ )
    {
        int nFlopsNew, nFlops = Vec_IntCountEntry(pNew->vRegClasses, iDom);
        if ( nFlops < 2 )
            continue;
        // find global equivalences
        pClp = Gia_ManDupCollapse( pNew, pNew->pAigExtra, NULL, 1 );
        // compute equivalences
        Gia_ManSweepComputeOneDomainEquivs( pClp, pNew->vRegClasses, iDom, pParsS, fConst, fEquiv, fVerbose );
        // transfer equivalences
        pReprs = Gia_ManFraigSelectReprs( pNew, pClp, fVerbose, pFlopTypes );
        Gia_ManStop( pClp );
        // reduce AIG
        Gia_ManTransferTiming( p, pNew );
        pNew = Gia_ManFraigReduceGia( pTemp = pNew, pReprs );
        Gia_ManTransferTiming( pNew, p );
        Gia_ManStop( pTemp );
        ABC_FREE( pReprs );
        // derive new AIG
        pNew = Gia_ManDupWithBoxes( pTemp = pNew, 1 );
        Gia_ManStop( pTemp );
        // report
        nFlopsNew = Vec_IntCountEntry(pNew->vRegClasses, iDom);
        pFlopTypes[2] = nFlops - nFlopsNew - (pFlopTypes[0] + pFlopTypes[1]);
        if ( fVerbEquivs )
        {
            printf( "Domain %2d : %5d -> %5d :  ", iDom, nFlops, nFlopsNew );
            printf( "EqConst =%4d.  EqFlop =%4d.  Dangling =%4d.  Unused =%4d.\n", 
                pFlopTypes[0], pFlopTypes[1], Abc_MaxInt(0, pFlopTypes[2]), Abc_MaxInt(0, -pFlopTypes[2]) );
            //Gia_ManPrintStats( pNew, NULL );
        }
    }
    // normalize the result
    pNew = Gia_ManDupNormalize( pTemp = pNew );
    Gia_ManTransferTiming( pNew, pTemp );
    Gia_ManStop( pTemp );
    // check integrity
    //Gia_ManCheckIntegrityWithBoxes( pNew );
    return pNew;
}